

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

void Mpm_ManPrepare(Mpm_Man_t *p)

{
  int iVar1;
  int iVar2;
  Mig_Obj_t *pMVar3;
  bool bVar4;
  int local_1c;
  int hCut;
  int i;
  Mig_Obj_t *pObj;
  Mpm_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(&p->pMig->vCis);
    bVar4 = false;
    if (local_1c < iVar1) {
      _hCut = Mig_ManCi(p->pMig,local_1c);
      bVar4 = _hCut != (Mig_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Mig_ObjId(_hCut);
    iVar1 = Mpm_CutCreateUnit(p,iVar1);
    Mpm_ObjSetCutBest(p,_hCut,iVar1);
    Mpm_ObjSetCutList(p,_hCut,iVar1);
    local_1c = local_1c + 1;
  }
  p->pMig->iPage = 0;
  while( true ) {
    iVar1 = p->pMig->iPage;
    iVar2 = Vec_PtrSize(&p->pMig->vPages);
    bVar4 = false;
    if (iVar1 < iVar2) {
      pMVar3 = (Mig_Obj_t *)Vec_PtrEntry(&p->pMig->vPages,p->pMig->iPage);
      p->pMig->pPage = pMVar3;
      bVar4 = pMVar3 != (Mig_Obj_t *)0x0;
    }
    if (!bVar4) break;
    _hCut = p->pMig->pPage;
    while (iVar1 = Mig_ObjIsNone(_hCut), iVar1 == 0) {
      iVar1 = Mig_ObjIsCand(_hCut);
      if (iVar1 != 0) {
        iVar1 = Mig_ObjRefNum(_hCut);
        Mpm_ObjSetEstRef(p,_hCut,iVar1 * 100);
      }
      _hCut = _hCut + 1;
    }
    p->pMig->iPage = p->pMig->iPage + 1;
  }
  return;
}

Assistant:

void Mpm_ManPrepare( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    int i, hCut;
    Mig_ManForEachCi( p->pMig, pObj, i )
    {
        hCut = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
        Mpm_ObjSetCutBest( p, pObj, hCut );
        Mpm_ObjSetCutList( p, pObj, hCut );
    }
    Mig_ManForEachCand( p->pMig, pObj )
        Mpm_ObjSetEstRef( p, pObj, MPM_UNIT_REFS * Mig_ObjRefNum(pObj) );
}